

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O3

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>
                **objToLoad,int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  short *psVar1;
  XMLCh *__src;
  XMLCh *__src_00;
  bool bVar2;
  int iVar3;
  uint uVar4;
  MemoryManager *pMVar5;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *this;
  DatatypeValidator *valueToAdopt;
  undefined4 extraout_var;
  XMLStringPool *pXVar6;
  undefined4 extraout_var_00;
  long lVar7;
  ulong uVar8;
  long lVar9;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  ArrayJanitor<char16_t> janName;
  XMLSize_t local_50;
  XMLSize_t local_48;
  ArrayJanitor<char16_t> local_40;
  char16_t *toDelete;
  
  bVar2 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar2) {
    XSerializeEngine::readSize(serEng,&local_48);
    this = *objToLoad;
    if (this == (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0) {
      pMVar5 = XSerializeEngine::getMemoryManager(serEng);
      this = (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,pMVar5);
      pMVar5 = XSerializeEngine::getMemoryManager(serEng);
      this->fMemoryManager = pMVar5;
      this->fAdoptedElems = toAdopt;
      this->fBucketList = (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> **)0x0;
      this->fHashModulus = local_48;
      this->fInitialModulus = local_48;
      this->fCount = 0;
      RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::initialize
                (this,local_48);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,this);
    local_50 = 0;
    XSerializeEngine::readSize(serEng,&local_50);
    if (local_50 != 0) {
      uVar8 = 0;
      do {
        valueToAdopt = DatatypeValidator::loadDV(serEng);
        __src = valueToAdopt->fTypeUri;
        lVar7 = 0;
        if (__src != (XMLCh *)0x0) {
          do {
            psVar1 = (short *)((long)__src + lVar7);
            lVar7 = lVar7 + 2;
          } while (*psVar1 != 0);
          lVar7 = (lVar7 >> 1) + -1;
        }
        __src_00 = valueToAdopt->fTypeLocalName;
        if (__src_00 == (XMLCh *)0x0) {
          lVar9 = 0;
        }
        else {
          lVar9 = 0;
          do {
            psVar1 = (short *)((long)__src_00 + lVar9);
            lVar9 = lVar9 + 2;
          } while (*psVar1 != 0);
          lVar9 = (lVar9 >> 1) + -1;
        }
        pMVar5 = XSerializeEngine::getMemoryManager(serEng);
        iVar3 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,(lVar9 + lVar7) * 2 + 4);
        toDelete = (char16_t *)CONCAT44(extraout_var,iVar3);
        memmove(toDelete,__src,lVar7 * 2 + 2);
        toDelete[lVar7] = L',';
        memmove(toDelete + lVar7 + 1,__src_00,lVar9 * 2 + 2);
        toDelete[lVar9 + lVar7 + 1] = L'\0';
        pMVar5 = XSerializeEngine::getMemoryManager(serEng);
        ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,pMVar5);
        pXVar6 = XSerializeEngine::getStringPool(serEng);
        uVar4 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[9])(pXVar6,toDelete);
        pXVar6 = XSerializeEngine::getStringPool(serEng);
        iVar3 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[10])(pXVar6,(ulong)uVar4);
        RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
                  (*objToLoad,(void *)CONCAT44(extraout_var_00,iVar3),valueToAdopt);
        ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
        uVar8 = uVar8 + 1;
      } while (uVar8 < local_50);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<DatatypeValidator>** objToLoad
                                   , int
                                   , bool                                toAdopt
                                   , XSerializeEngine&                   serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<DatatypeValidator>(
                                                               hashModulus
                                                             , toAdopt
                                                             , serEng.getMemoryManager()
                                                             );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            DatatypeValidator*  data;
            data = DatatypeValidator::loadDV(serEng);

            /***
             *   restore the key
             ***/
            XMLCh*       typeUri   = (XMLCh*) data->getTypeUri();
            XMLCh*       typeLocal = (XMLCh*) data->getTypeLocalName();
            XMLSize_t    uriLen    = XMLString::stringLen(typeUri);
            XMLSize_t    localLen  = XMLString::stringLen(typeLocal);
            XMLCh*       typeKey   = (XMLCh*) serEng.getMemoryManager()->allocate
                                     (
                                       (uriLen + localLen + 2) * sizeof(XMLCh)
                                     );
            // "typeuri,typeLocal"
            XMLString::moveChars(typeKey, typeUri, uriLen+1);
            typeKey[uriLen] = chComma;
            XMLString::moveChars(&typeKey[uriLen+1], typeLocal, localLen+1);
            typeKey[uriLen + localLen + 1] = chNull;
            ArrayJanitor<XMLCh> janName(typeKey, serEng.getMemoryManager());

            /*
             * get the string from string pool
             *
             *  to do:
             ***/
            unsigned int id = serEng.getStringPool()->getId(typeKey);
            XMLCh* refKey = (XMLCh*) serEng.getStringPool()->getValueForId(id);

            (*objToLoad)->put((void*)refKey, data);
        }
    }
}